

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::JoinStrings
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *components,char *delim,string *result)

{
  pointer pbVar1;
  LogMessage *other;
  long lVar2;
  pointer pbVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  pointer pbVar4;
  LogFinisher local_69;
  LogMessage local_68;
  
  pbVar4 = (components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (result == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x108);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: result != nullptr: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  result->_M_string_length = 0;
  *(result->_M_dataplus)._M_p = '\0';
  strlen(delim);
  pbVar3 = pbVar4;
  if (pbVar1 == pbVar4) {
    std::__cxx11::string::reserve((ulong)result);
  }
  else {
    do {
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
    std::__cxx11::string::reserve((ulong)result);
    if (pbVar1 != pbVar4) {
      lVar2 = 0;
      do {
        if (lVar2 != 0) {
          std::__cxx11::string::append((char *)result,(ulong)delim);
        }
        std::__cxx11::string::append((char *)result,(ulong)(pbVar4->_M_dataplus)._M_p);
        pbVar4 = pbVar4 + 1;
        lVar2 = lVar2 + -0x20;
      } while (pbVar4 != pbVar1);
    }
  }
  return;
}

Assistant:

void JoinStrings(const std::vector<std::string> &components, const char *delim,
                 std::string *result) {
  JoinStringsIterator(components.begin(), components.end(), delim, result);
}